

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

bool prometheus::(anonymous_namespace)::
     FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&>
               (string *name,
               vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
               *families,
               vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
               *args,vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
                     *args_1,
               vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
               *args_2)

{
  bool local_69;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>_>
  local_68;
  string *local_60;
  unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
  *local_58;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>_>
  local_50;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>_>
  local_48;
  undefined1 local_39;
  anon_class_8_1_898f2789_for__M_pred aStack_38;
  bool exists;
  anon_class_8_1_898f2789_for__M_pred sameName;
  vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
  *args_local_2;
  vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
  *args_local_1;
  vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
  *args_local;
  vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
  *families_local;
  string *name_local;
  
  aStack_38.name = name;
  sameName.name = (string *)args_2;
  local_50._M_current =
       (unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
        *)std::
          begin<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>>
                    (families);
  local_58 = (unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
              *)std::
                end<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>>
                          (families);
  local_60 = aStack_38.name;
  local_48 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const*,std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>>,prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>___Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)_1_>
                       (local_50,(__normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>_>
                                  )local_58,aStack_38);
  local_68._M_current =
       (unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
        *)std::
          end<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>>
                    (families);
  local_39 = __gnu_cxx::operator!=(&local_48,&local_68);
  local_69 = true;
  if (!(bool)local_39) {
    local_69 = FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>const&>
                         (name,args,args_1,
                          (vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
                           *)sameName.name);
  }
  return local_69;
}

Assistant:

bool FamilyNameExists(const std::string& name, const T& families,
                      Args&&... args) {
  auto sameName = [&name](const typename T::value_type& entry) {
    return name == entry->GetName();
  };
  auto exists = std::find_if(std::begin(families), std::end(families),
                             sameName) != std::end(families);
  return exists || FamilyNameExists(name, args...);
}